

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O1

void fill_block(__m256i *state,block *ref_block,block *next_block,int with_xor)

{
  uint *puVar1;
  ulong *puVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  __m256i block_XY [32];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  
  lVar37 = 0;
  if (with_xor == 0) {
    do {
      puVar1 = (uint *)((long)ref_block->v + lVar37);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      uVar12 = puVar1[2];
      uVar13 = puVar1[3];
      uVar14 = puVar1[4];
      uVar15 = puVar1[5];
      uVar16 = puVar1[6];
      uVar17 = puVar1[7];
      puVar1 = (uint *)((long)*state + lVar37);
      uVar18 = *puVar1;
      uVar19 = puVar1[1];
      uVar20 = puVar1[2];
      uVar21 = puVar1[3];
      uVar22 = puVar1[4];
      uVar23 = puVar1[5];
      uVar24 = puVar1[6];
      uVar25 = puVar1[7];
      puVar1 = (uint *)((long)*state + lVar37);
      *puVar1 = uVar10 ^ uVar18;
      puVar1[1] = uVar11 ^ uVar19;
      puVar1[2] = uVar12 ^ uVar20;
      puVar1[3] = uVar13 ^ uVar21;
      puVar1[4] = uVar14 ^ uVar22;
      puVar1[5] = uVar15 ^ uVar23;
      puVar1[6] = uVar16 ^ uVar24;
      puVar1[7] = uVar17 ^ uVar25;
      *(uint *)((long)&local_440 + lVar37) = uVar10 ^ uVar18;
      *(uint *)((long)&local_440 + lVar37 + 4) = uVar11 ^ uVar19;
      *(uint *)((long)&uStack_438 + lVar37) = uVar12 ^ uVar20;
      *(uint *)((long)&uStack_438 + lVar37 + 4) = uVar13 ^ uVar21;
      *(uint *)((long)&uStack_430 + lVar37) = uVar14 ^ uVar22;
      *(uint *)((long)&uStack_430 + lVar37 + 4) = uVar15 ^ uVar23;
      *(uint *)((long)&uStack_428 + lVar37) = uVar16 ^ uVar24;
      *(uint *)((long)&uStack_428 + lVar37 + 4) = uVar17 ^ uVar25;
      lVar37 = lVar37 + 0x20;
    } while (lVar37 != 0x400);
  }
  else {
    do {
      puVar1 = (uint *)((long)ref_block->v + lVar37);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      uVar12 = puVar1[2];
      uVar13 = puVar1[3];
      uVar14 = puVar1[4];
      uVar15 = puVar1[5];
      uVar16 = puVar1[6];
      uVar17 = puVar1[7];
      puVar1 = (uint *)((long)*state + lVar37);
      uVar18 = *puVar1;
      uVar19 = puVar1[1];
      uVar20 = puVar1[2];
      uVar21 = puVar1[3];
      uVar22 = puVar1[4];
      uVar23 = puVar1[5];
      uVar24 = puVar1[6];
      uVar25 = puVar1[7];
      puVar1 = (uint *)((long)*state + lVar37);
      *puVar1 = uVar10 ^ uVar18;
      puVar1[1] = uVar11 ^ uVar19;
      puVar1[2] = uVar12 ^ uVar20;
      puVar1[3] = uVar13 ^ uVar21;
      puVar1[4] = uVar14 ^ uVar22;
      puVar1[5] = uVar15 ^ uVar23;
      puVar1[6] = uVar16 ^ uVar24;
      puVar1[7] = uVar17 ^ uVar25;
      puVar1 = (uint *)((long)next_block->v + lVar37);
      uVar26 = puVar1[1];
      uVar27 = puVar1[2];
      uVar28 = puVar1[3];
      uVar29 = puVar1[4];
      uVar30 = puVar1[5];
      uVar31 = puVar1[6];
      uVar32 = puVar1[7];
      *(uint *)((long)&local_440 + lVar37) = uVar10 ^ uVar18 ^ *puVar1;
      *(uint *)((long)&local_440 + lVar37 + 4) = uVar11 ^ uVar19 ^ uVar26;
      *(uint *)((long)&uStack_438 + lVar37) = uVar12 ^ uVar20 ^ uVar27;
      *(uint *)((long)&uStack_438 + lVar37 + 4) = uVar13 ^ uVar21 ^ uVar28;
      *(uint *)((long)&uStack_430 + lVar37) = uVar14 ^ uVar22 ^ uVar29;
      *(uint *)((long)&uStack_430 + lVar37 + 4) = uVar15 ^ uVar23 ^ uVar30;
      *(uint *)((long)&uStack_428 + lVar37) = uVar16 ^ uVar24 ^ uVar31;
      *(uint *)((long)&uStack_428 + lVar37 + 4) = uVar17 ^ uVar25 ^ uVar32;
      lVar37 = lVar37 + 0x20;
    } while (lVar37 != 0x400);
  }
  lVar37 = 0;
  auVar38._16_16_ = _DAT_00117a80;
  auVar38._0_16_ = _DAT_00117a80;
  do {
    auVar3 = *(undefined1 (*) [32])((long)*state + lVar37);
    auVar39 = *(undefined1 (*) [32])((long)state[1] + lVar37);
    auVar4 = *(undefined1 (*) [32])((long)state[2] + lVar37);
    auVar42 = *(undefined1 (*) [32])((long)state[4] + lVar37);
    auVar41 = vpmuludq_avx2(auVar39,auVar3);
    auVar41 = vpaddq_avx2(auVar41,auVar41);
    auVar3 = vpaddq_avx2(auVar39,auVar3);
    auVar41 = vpaddq_avx2(auVar3,auVar41);
    auVar3 = vpshufd_avx2(auVar41 ^ *(undefined1 (*) [32])((long)state[3] + lVar37),0xb1);
    *(undefined1 (*) [32])((long)state[3] + lVar37) = auVar3;
    auVar3 = vpmuludq_avx2(auVar3,auVar4);
    auVar43 = vpaddq_avx2(auVar3,auVar3);
    auVar3 = *(undefined1 (*) [32])((long)state[3] + lVar37);
    auVar4 = vpaddq_avx2(auVar3,auVar4);
    auVar43 = vpaddq_avx2(auVar4,auVar43);
    auVar6 = vpshufb_avx2(auVar43 ^ auVar39,auVar38);
    auVar39 = *(undefined1 (*) [32])((long)state[5] + lVar37);
    auVar4 = vpmuludq_avx2(auVar39,auVar42);
    auVar4 = vpaddq_avx2(auVar4,auVar4);
    auVar42 = vpaddq_avx2(auVar39,auVar42);
    auVar44 = vpaddq_avx2(auVar42,auVar4);
    auVar42 = vpshufd_avx2(auVar44 ^ *(undefined1 (*) [32])((long)state[7] + lVar37),0xb1);
    *(undefined1 (*) [32])((long)state[7] + lVar37) = auVar42;
    auVar4 = *(undefined1 (*) [32])((long)state[6] + lVar37);
    auVar42 = vpmuludq_avx2(auVar4,auVar42);
    auVar5 = vpaddq_avx2(auVar42,auVar42);
    auVar42 = *(undefined1 (*) [32])((long)state[7] + lVar37);
    auVar4 = vpaddq_avx2(auVar42,auVar4);
    auVar4 = vpaddq_avx2(auVar4,auVar5);
    auVar7 = vpshufb_avx2(auVar4 ^ auVar39,auVar38);
    auVar39 = vpmuludq_avx2(auVar6,auVar41);
    auVar39 = vpaddq_avx2(auVar39,auVar39);
    auVar41 = vpaddq_avx2(auVar41,auVar6);
    auVar39 = vpaddq_avx2(auVar39,auVar41);
    auVar3 = vpshuflw_avx2(auVar39 ^ auVar3,0x39);
    auVar40 = vpshufhw_avx2(auVar3,0x39);
    auVar3 = vpmuludq_avx2(auVar40,auVar43);
    auVar3 = vpaddq_avx2(auVar3,auVar3);
    auVar41 = vpaddq_avx2(auVar43,auVar40);
    auVar3 = vpaddq_avx2(auVar3,auVar41);
    auVar6 = auVar3 ^ auVar6;
    auVar43 = vpsrlq_avx2(auVar6,0x3f);
    auVar41 = vpaddq_avx2(auVar6,auVar6);
    auVar5 = vpor_avx2(auVar43,auVar41);
    auVar41 = vpmuludq_avx2(auVar7,auVar44);
    auVar41 = vpaddq_avx2(auVar41,auVar41);
    auVar43 = vpaddq_avx2(auVar44,auVar7);
    auVar41 = vpaddq_avx2(auVar43,auVar41);
    auVar42 = vpshuflw_avx2(auVar42 ^ auVar41,0x39);
    auVar43 = vpshufhw_avx2(auVar42,0x39);
    auVar42 = vpmuludq_avx2(auVar43,auVar4);
    auVar42 = vpaddq_avx2(auVar42,auVar42);
    auVar4 = vpaddq_avx2(auVar4,auVar43);
    auVar4 = vpaddq_avx2(auVar42,auVar4);
    auVar7 = auVar4 ^ auVar7;
    auVar44 = vpsrlq_avx2(auVar7,0x3f);
    auVar42 = vpaddq_avx2(auVar7,auVar7);
    auVar42 = vpor_avx2(auVar44,auVar42);
    auVar44 = vpermq_avx2(auVar5,0x39);
    auVar6 = vpermq_avx2(auVar3,0x4e);
    auVar7 = vpermq_avx2(auVar40,0x93);
    auVar40 = vpermq_avx2(auVar42,0x39);
    auVar8 = vpermq_avx2(auVar4,0x4e);
    auVar9 = vpermq_avx2(auVar43,0x93);
    auVar3 = vpmuludq_avx2(auVar44,auVar39);
    auVar3 = vpaddq_avx2(auVar3,auVar3);
    auVar39 = vpaddq_avx2(auVar44,auVar39);
    auVar3 = vpaddq_avx2(auVar3,auVar39);
    auVar5 = vpshufd_avx2(auVar3,0xb1);
    auVar39 = vpshufd_avx2(auVar7,0xb1);
    auVar5 = auVar5 ^ auVar39;
    auVar39 = vpmuludq_avx2(auVar5,auVar6);
    auVar39 = vpaddq_avx2(auVar39,auVar39);
    auVar4 = vpaddq_avx2(auVar6,auVar5);
    auVar39 = vpaddq_avx2(auVar4,auVar39);
    auVar43 = vpshufb_avx2(auVar44 ^ auVar39,auVar38);
    auVar4 = vpmuludq_avx2(auVar40,auVar41);
    auVar4 = vpaddq_avx2(auVar4,auVar4);
    auVar42 = vpaddq_avx2(auVar40,auVar41);
    auVar4 = vpaddq_avx2(auVar42,auVar4);
    auVar6 = vpshufd_avx2(auVar4,0xb1);
    auVar42 = vpshufd_avx2(auVar9,0xb1);
    auVar6 = auVar6 ^ auVar42;
    auVar42 = vpmuludq_avx2(auVar6,auVar8);
    auVar42 = vpaddq_avx2(auVar42,auVar42);
    auVar41 = vpaddq_avx2(auVar8,auVar6);
    auVar42 = vpaddq_avx2(auVar41,auVar42);
    auVar44 = vpshufb_avx2(auVar42 ^ auVar40,auVar38);
    auVar41 = vpmuludq_avx2(auVar43,auVar3);
    auVar41 = vpaddq_avx2(auVar41,auVar41);
    auVar3 = vpaddq_avx2(auVar3,auVar43);
    auVar3 = vpaddq_avx2(auVar3,auVar41);
    *(undefined1 (*) [32])((long)*state + lVar37) = auVar3;
    auVar3 = vpshuflw_avx2(auVar3,0x39);
    auVar7 = vpshufhw_avx2(auVar3,0x39);
    auVar3 = vpshuflw_avx2(auVar5,0x39);
    auVar3 = vpshufhw_avx2(auVar3,0x39);
    auVar7 = auVar7 ^ auVar3;
    auVar3 = vpmuludq_avx2(auVar7,auVar39);
    auVar3 = vpaddq_avx2(auVar3,auVar3);
    auVar39 = vpaddq_avx2(auVar39,auVar7);
    auVar3 = vpaddq_avx2(auVar39,auVar3);
    auVar43 = auVar43 ^ auVar3;
    auVar41 = vpsrlq_avx2(auVar43,0x3f);
    auVar39 = vpaddq_avx2(auVar43,auVar43);
    auVar41 = vpor_avx2(auVar39,auVar41);
    auVar39 = vpmuludq_avx2(auVar4,auVar44);
    auVar39 = vpaddq_avx2(auVar39,auVar39);
    auVar4 = vpaddq_avx2(auVar4,auVar44);
    auVar39 = vpaddq_avx2(auVar4,auVar39);
    *(undefined1 (*) [32])((long)state[4] + lVar37) = auVar39;
    auVar39 = vpshuflw_avx2(auVar39,0x39);
    auVar43 = vpshufhw_avx2(auVar39,0x39);
    auVar39 = vpshuflw_avx2(auVar6,0x39);
    auVar39 = vpshufhw_avx2(auVar39,0x39);
    auVar43 = auVar43 ^ auVar39;
    auVar39 = vpmuludq_avx2(auVar43,auVar42);
    auVar39 = vpaddq_avx2(auVar39,auVar39);
    auVar4 = vpaddq_avx2(auVar42,auVar43);
    auVar39 = vpaddq_avx2(auVar4,auVar39);
    auVar44 = auVar39 ^ auVar44;
    auVar42 = vpsrlq_avx2(auVar44,0x3f);
    auVar4 = vpaddq_avx2(auVar44,auVar44);
    auVar4 = vpor_avx2(auVar4,auVar42);
    auVar42 = vpermq_avx2(auVar41,0x93);
    *(undefined1 (*) [32])((long)state[1] + lVar37) = auVar42;
    auVar3 = vpermq_avx2(auVar3,0x4e);
    *(undefined1 (*) [32])((long)state[2] + lVar37) = auVar3;
    auVar3 = vpermq_avx2(auVar7,0x39);
    *(undefined1 (*) [32])((long)state[3] + lVar37) = auVar3;
    auVar3 = vpermq_avx2(auVar4,0x93);
    *(undefined1 (*) [32])((long)state[5] + lVar37) = auVar3;
    auVar3 = vpermq_avx2(auVar39,0x4e);
    *(undefined1 (*) [32])((long)state[6] + lVar37) = auVar3;
    auVar3 = vpermq_avx2(auVar43,0x39);
    *(undefined1 (*) [32])((long)state[7] + lVar37) = auVar3;
    lVar37 = lVar37 + 0x100;
  } while (lVar37 != 0x400);
  lVar37 = -0x80;
  do {
    auVar3 = *(undefined1 (*) [32])((long)state[4] + lVar37);
    auVar39 = *(undefined1 (*) [32])((long)state[8] + lVar37);
    auVar4 = *(undefined1 (*) [32])((long)state[0xc] + lVar37);
    auVar42 = vpmuludq_avx2(auVar4,auVar3);
    auVar42 = vpaddq_avx2(auVar42,auVar42);
    auVar3 = vpaddq_avx2(auVar4,auVar3);
    auVar43 = vpaddq_avx2(auVar3,auVar42);
    auVar3 = *(undefined1 (*) [32])((long)state[0x10] + lVar37);
    auVar41 = vpshufd_avx2(auVar43 ^ *(undefined1 (*) [32])((long)state[0x1c] + lVar37),0xb1);
    *(undefined1 (*) [32])((long)state[0x1c] + lVar37) = auVar41;
    auVar42 = *(undefined1 (*) [32])((long)state[0x14] + lVar37);
    auVar41 = vpmuludq_avx2(auVar41,auVar42);
    auVar44 = vpaddq_avx2(auVar41,auVar41);
    auVar41 = *(undefined1 (*) [32])((long)state[0x1c] + lVar37);
    auVar42 = vpaddq_avx2(auVar41,auVar42);
    auVar42 = vpaddq_avx2(auVar42,auVar44);
    *(undefined1 (*) [32])((long)state[0x14] + lVar37) = auVar42;
    auVar6 = vpshufb_avx2(auVar42 ^ auVar4,auVar38);
    *(undefined1 (*) [32])((long)state[0xc] + lVar37) = auVar6;
    auVar4 = vpmuludq_avx2(auVar3,auVar39);
    auVar4 = vpaddq_avx2(auVar4,auVar4);
    auVar39 = vpaddq_avx2(auVar3,auVar39);
    auVar44 = vpaddq_avx2(auVar39,auVar4);
    *(undefined1 (*) [32])((long)state[8] + lVar37) = auVar44;
    auVar4 = vpshufd_avx2(auVar44 ^ *(undefined1 (*) [32])((long)state[0x20] + lVar37),0xb1);
    *(undefined1 (*) [32])((long)state[0x20] + lVar37) = auVar4;
    auVar39 = *(undefined1 (*) [32])((long)state[0x18] + lVar37);
    auVar4 = vpmuludq_avx2(auVar4,auVar39);
    auVar5 = vpaddq_avx2(auVar4,auVar4);
    auVar4 = *(undefined1 (*) [32])((long)state[0x20] + lVar37);
    auVar39 = vpaddq_avx2(auVar4,auVar39);
    auVar39 = vpaddq_avx2(auVar39,auVar5);
    *(undefined1 (*) [32])((long)state[0x18] + lVar37) = auVar39;
    auVar5 = vpshufb_avx2(auVar39 ^ auVar3,auVar38);
    *(undefined1 (*) [32])((long)state[0x10] + lVar37) = auVar5;
    auVar3 = vpmuludq_avx2(auVar6,auVar43);
    auVar3 = vpaddq_avx2(auVar3,auVar3);
    auVar43 = vpaddq_avx2(auVar43,auVar6);
    auVar43 = vpaddq_avx2(auVar43,auVar3);
    *(undefined1 (*) [32])((long)state[4] + lVar37) = auVar43;
    auVar3 = vpshuflw_avx2(auVar41 ^ auVar43,0x39);
    auVar41 = vpshufhw_avx2(auVar3,0x39);
    *(undefined1 (*) [32])((long)state[0x1c] + lVar37) = auVar41;
    auVar3 = vpmuludq_avx2(auVar41,auVar42);
    auVar3 = vpaddq_avx2(auVar3,auVar3);
    auVar42 = vpaddq_avx2(auVar42,auVar41);
    auVar42 = vpaddq_avx2(auVar3,auVar42);
    *(undefined1 (*) [32])((long)state[0x14] + lVar37) = auVar42;
    auVar6 = auVar42 ^ auVar6;
    auVar41 = vpsrlq_avx2(auVar6,0x3f);
    auVar3 = vpaddq_avx2(auVar6,auVar6);
    auVar6 = vpor_avx2(auVar3,auVar41);
    *(undefined1 (*) [32])((long)state[0xc] + lVar37) = auVar6;
    auVar3 = vpmuludq_avx2(auVar5,auVar44);
    auVar3 = vpaddq_avx2(auVar3,auVar3);
    auVar41 = vpaddq_avx2(auVar44,auVar5);
    auVar41 = vpaddq_avx2(auVar41,auVar3);
    *(undefined1 (*) [32])((long)state[8] + lVar37) = auVar41;
    auVar3 = vpshuflw_avx2(auVar4 ^ auVar41,0x39);
    auVar4 = vpshufhw_avx2(auVar3,0x39);
    *(undefined1 (*) [32])((long)state[0x20] + lVar37) = auVar4;
    auVar3 = vpmuludq_avx2(auVar4,auVar39);
    auVar3 = vpaddq_avx2(auVar3,auVar3);
    auVar39 = vpaddq_avx2(auVar39,auVar4);
    auVar4 = vpaddq_avx2(auVar3,auVar39);
    *(undefined1 (*) [32])((long)state[0x18] + lVar37) = auVar4;
    auVar5 = auVar4 ^ auVar5;
    auVar39 = vpsrlq_avx2(auVar5,0x3f);
    auVar3 = vpaddq_avx2(auVar5,auVar5);
    auVar3 = vpor_avx2(auVar3,auVar39);
    auVar5 = vpalignr_avx2(auVar6,auVar3,8);
    *(undefined1 (*) [32])((long)state[0x10] + lVar37) = auVar5;
    auVar6 = vpalignr_avx2(auVar3,auVar6,8);
    *(undefined1 (*) [32])((long)state[0xc] + lVar37) = auVar6;
    *(undefined1 (*) [32])((long)state[0x14] + lVar37) = auVar4;
    *(undefined1 (*) [32])((long)state[0x18] + lVar37) = auVar42;
    auVar3 = *(undefined1 (*) [32])((long)state[0x1c] + lVar37);
    auVar39 = *(undefined1 (*) [32])((long)state[0x20] + lVar37);
    auVar7 = vpalignr_avx2(auVar39,auVar3,8);
    *(undefined1 (*) [32])((long)state[0x20] + lVar37) = auVar7;
    auVar44 = vpmuludq_avx2(auVar6,auVar43);
    auVar44 = vpaddq_avx2(auVar44,auVar44);
    auVar43 = vpaddq_avx2(auVar6,auVar43);
    auVar43 = vpaddq_avx2(auVar44,auVar43);
    *(undefined1 (*) [32])((long)state[4] + lVar37) = auVar43;
    auVar44 = vpshufd_avx2(auVar43,0xb1);
    auVar3 = vshufps_avx(auVar39,auVar3,0x1b);
    auVar40._0_4_ = auVar44._0_4_ ^ auVar3._0_4_;
    auVar40._4_4_ = auVar44._4_4_ ^ auVar3._4_4_;
    auVar40._8_4_ = auVar44._8_4_ ^ auVar3._8_4_;
    auVar40._12_4_ = auVar44._12_4_ ^ auVar3._12_4_;
    auVar40._16_4_ = auVar44._16_4_ ^ auVar3._16_4_;
    auVar40._20_4_ = auVar44._20_4_ ^ auVar3._20_4_;
    auVar40._24_4_ = auVar44._24_4_ ^ auVar3._24_4_;
    auVar40._28_4_ = auVar44._28_4_ ^ auVar3._28_4_;
    *(undefined1 (*) [32])((long)state[0x1c] + lVar37) = auVar40;
    auVar3 = vpmuludq_avx2(auVar40,auVar4);
    auVar3 = vpaddq_avx2(auVar3,auVar3);
    auVar39 = vpaddq_avx2(auVar4,auVar40);
    auVar3 = vpaddq_avx2(auVar3,auVar39);
    *(undefined1 (*) [32])((long)state[0x14] + lVar37) = auVar3;
    auVar44 = vpshufb_avx2(auVar3,auVar38);
    auVar39 = vpshufb_avx2(auVar6,auVar38);
    auVar44 = auVar44 ^ auVar39;
    *(undefined1 (*) [32])((long)state[0xc] + lVar37) = auVar44;
    auVar39 = vpmuludq_avx2(auVar5,auVar41);
    auVar39 = vpaddq_avx2(auVar39,auVar39);
    auVar4 = vpaddq_avx2(auVar5,auVar41);
    auVar39 = vpaddq_avx2(auVar39,auVar4);
    *(undefined1 (*) [32])((long)state[8] + lVar37) = auVar39;
    auVar7 = vpshufd_avx2(auVar7 ^ auVar39,0xb1);
    *(undefined1 (*) [32])((long)state[0x20] + lVar37) = auVar7;
    auVar4 = vpmuludq_avx2(auVar7,auVar42);
    auVar4 = vpaddq_avx2(auVar4,auVar4);
    auVar42 = vpaddq_avx2(auVar7,auVar42);
    auVar4 = vpaddq_avx2(auVar4,auVar42);
    auVar6 = vpshufb_avx2(auVar4,auVar38);
    auVar42 = vpshufb_avx2(auVar5,auVar38);
    auVar6 = auVar6 ^ auVar42;
    auVar42 = vpmuludq_avx2(auVar44,auVar43);
    auVar42 = vpaddq_avx2(auVar42,auVar42);
    auVar41 = vpaddq_avx2(auVar43,auVar44);
    auVar42 = vpaddq_avx2(auVar41,auVar42);
    *(undefined1 (*) [32])((long)state[4] + lVar37) = auVar42;
    auVar5 = vpshuflw_avx2(auVar42 ^ auVar40,0x39);
    auVar43 = vpshufhw_avx2(auVar5,0x39);
    auVar42 = vpmuludq_avx2(auVar43,auVar3);
    auVar42 = vpaddq_avx2(auVar42,auVar42);
    auVar3 = vpaddq_avx2(auVar3,auVar43);
    auVar3 = vpaddq_avx2(auVar3,auVar42);
    auVar44 = auVar3 ^ auVar44;
    auVar41 = vpsrlq_avx2(auVar44,0x3f);
    auVar42 = vpaddq_avx2(auVar44,auVar44);
    auVar41 = vpor_avx2(auVar42,auVar41);
    auVar42 = vpmuludq_avx2(auVar6,auVar39);
    auVar42 = vpaddq_avx2(auVar42,auVar42);
    auVar39 = vpaddq_avx2(auVar39,auVar6);
    auVar39 = vpaddq_avx2(auVar39,auVar42);
    *(undefined1 (*) [32])((long)state[8] + lVar37) = auVar39;
    auVar7 = vpshuflw_avx2(auVar7 ^ auVar39,0x39);
    auVar44 = vpshufhw_avx2(auVar7,0x39);
    auVar39 = vpmuludq_avx2(auVar4,auVar44);
    auVar39 = vpaddq_avx2(auVar39,auVar39);
    auVar4 = vpaddq_avx2(auVar4,auVar44);
    auVar39 = vpaddq_avx2(auVar4,auVar39);
    auVar6 = auVar39 ^ auVar6;
    auVar42 = vpsrlq_avx2(auVar6,0x3f);
    auVar4 = vpaddq_avx2(auVar6,auVar6);
    auVar42 = vpor_avx2(auVar42,auVar4);
    auVar4 = vpalignr_avx2(auVar41,auVar42,8);
    *(undefined1 (*) [32])((long)state[0xc] + lVar37) = auVar4;
    auVar4 = vpalignr_avx2(auVar42,auVar41,8);
    *(undefined1 (*) [32])((long)state[0x10] + lVar37) = auVar4;
    *(undefined1 (*) [32])((long)state[0x14] + lVar37) = auVar39;
    *(undefined1 (*) [32])((long)state[0x18] + lVar37) = auVar3;
    auVar3 = vpalignr_avx2(auVar7,auVar43,8);
    *(undefined1 (*) [32])((long)state[0x1c] + lVar37) = auVar3;
    auVar3 = vpalignr_avx2(auVar5,auVar44,8);
    *(undefined1 (*) [32])((long)state[0x20] + lVar37) = auVar3;
    lVar37 = lVar37 + 0x20;
  } while (lVar37 != 0);
  lVar37 = 0;
  do {
    puVar2 = (ulong *)((long)*state + lVar37);
    uVar33 = *(ulong *)((long)&local_440 + lVar37) ^ *puVar2;
    uVar34 = *(ulong *)((long)&uStack_438 + lVar37) ^ puVar2[1];
    uVar35 = *(ulong *)((long)&uStack_430 + lVar37) ^ puVar2[2];
    uVar36 = *(ulong *)((long)&uStack_428 + lVar37) ^ puVar2[3];
    puVar2 = (ulong *)((long)*state + lVar37);
    *puVar2 = uVar33;
    puVar2[1] = uVar34;
    puVar2[2] = uVar35;
    puVar2[3] = uVar36;
    puVar2 = (ulong *)((long)next_block->v + lVar37);
    *puVar2 = uVar33;
    puVar2[1] = uVar34;
    puVar2[2] = uVar35;
    puVar2[3] = uVar36;
    lVar37 = lVar37 + 0x20;
  } while (lVar37 != 0x400);
  return;
}

Assistant:

static void fill_block(const block *prev_block, const block *ref_block,
	block *next_block, int with_xor) {
	block blockR, block_tmp;
	unsigned i;

	copy_block(&blockR, ref_block);
	xor_block(&blockR, prev_block);
	copy_block(&block_tmp, &blockR);
	/* Now blockR = ref_block + prev_block and block_tmp = ref_block + prev_block */
	if (with_xor) {
		/* Saving the next block contents for XOR over: */
		xor_block(&block_tmp, next_block);
		/* Now blockR = ref_block + prev_block and
		   block_tmp = ref_block + prev_block + next_block */
	}

	/* Apply Blake2 on columns of 64-bit words: (0,1,...,15) , then
	   (16,17,..31)... finally (112,113,...127) */
	for (i = 0; i < 8; ++i) {
		BLAKE2_ROUND_NOMSG(
			blockR.v[16 * i], blockR.v[16 * i + 1], blockR.v[16 * i + 2],
			blockR.v[16 * i + 3], blockR.v[16 * i + 4], blockR.v[16 * i + 5],
			blockR.v[16 * i + 6], blockR.v[16 * i + 7], blockR.v[16 * i + 8],
			blockR.v[16 * i + 9], blockR.v[16 * i + 10], blockR.v[16 * i + 11],
			blockR.v[16 * i + 12], blockR.v[16 * i + 13], blockR.v[16 * i + 14],
			blockR.v[16 * i + 15]);
	}

	/* Apply Blake2 on rows of 64-bit words: (0,1,16,17,...112,113), then
	   (2,3,18,19,...,114,115).. finally (14,15,30,31,...,126,127) */
	for (i = 0; i < 8; i++) {
		BLAKE2_ROUND_NOMSG(
			blockR.v[2 * i], blockR.v[2 * i + 1], blockR.v[2 * i + 16],
			blockR.v[2 * i + 17], blockR.v[2 * i + 32], blockR.v[2 * i + 33],
			blockR.v[2 * i + 48], blockR.v[2 * i + 49], blockR.v[2 * i + 64],
			blockR.v[2 * i + 65], blockR.v[2 * i + 80], blockR.v[2 * i + 81],
			blockR.v[2 * i + 96], blockR.v[2 * i + 97], blockR.v[2 * i + 112],
			blockR.v[2 * i + 113]);
	}

	copy_block(next_block, &block_tmp);
	xor_block(next_block, &blockR);
}